

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestSingle_AsDiyFp(void)

{
  DiyFp DVar1;
  uint32_t max_float32;
  uint32_t min_float32;
  DiyFp diy_fp;
  uint32_t ordered;
  int value;
  Single *in_stack_ffffffffffffff40;
  Single *this;
  int expected;
  DiyFp *this_00;
  int line;
  char *in_stack_ffffffffffffff60;
  char *file;
  Single local_7c;
  uint64_t local_78;
  int32_t local_70;
  undefined4 local_64;
  uint64_t local_60;
  int32_t local_58;
  Single local_4c;
  uint64_t local_48;
  int32_t local_40;
  undefined4 local_34;
  uint64_t local_30;
  int32_t local_28;
  Single local_1c;
  DiyFp local_18;
  undefined4 local_4;
  
  local_4 = 0x1234567;
  double_conversion::Single::Single(&local_1c,0x1234567);
  DVar1 = double_conversion::Single::AsDiyFp(in_stack_ffffffffffffff40);
  local_30 = DVar1.f_;
  local_28 = DVar1.e_;
  this_00 = &local_18;
  local_18.f_ = local_30;
  local_18.e_ = local_28;
  double_conversion::DiyFp::e(this_00);
  line = 0;
  expected = 0;
  value = (int)((ulong)&local_1c >> 0x20);
  CheckEqualsHelper(in_stack_ffffffffffffff60,0,(char *)this_00,0,(char *)in_stack_ffffffffffffff40,
                    value);
  double_conversion::DiyFp::f(this_00);
  file = "diy_fp.f()";
  CheckEqualsHelper("diy_fp.f()",line,(char *)this_00,expected,(char *)in_stack_ffffffffffffff40,
                    value);
  local_34 = 1;
  this = &local_4c;
  double_conversion::Single::Single(this,1);
  DVar1 = double_conversion::Single::AsDiyFp(this);
  local_60 = DVar1.f_;
  local_58 = DVar1.e_;
  local_48 = local_60;
  local_40 = local_58;
  local_18.f_ = local_60;
  local_18.e_ = local_58;
  double_conversion::DiyFp::e(this_00);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,value);
  double_conversion::DiyFp::f(this_00);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,value);
  local_64 = 0x7f7fffff;
  double_conversion::Single::Single(&local_7c,0x7f7fffff);
  DVar1 = double_conversion::Single::AsDiyFp(this);
  local_78 = DVar1.f_;
  local_70 = DVar1.e_;
  local_18.f_ = local_78;
  local_18.e_ = local_70;
  double_conversion::DiyFp::e(&local_18);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,value);
  double_conversion::DiyFp::f(&local_18);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,value);
  return;
}

Assistant:

TEST(Single_AsDiyFp) {
  uint32_t ordered = 0x01234567;
  DiyFp diy_fp = Single(ordered).AsDiyFp();
  CHECK_EQ(0x2 - 0x7F - 23, diy_fp.e());
  // The 23 mantissa bits, plus the implicit 1 in bit 24 as a uint32_t.
  CHECK_EQ(0xA34567, diy_fp.f());

  uint32_t min_float32 = 0x00000001;
  diy_fp = Single(min_float32).AsDiyFp();
  CHECK_EQ(-0x7F - 23 + 1, diy_fp.e());
  // This is a denormal; so no hidden bit.
  CHECK_EQ(1, diy_fp.f());

  uint32_t max_float32 = 0x7f7fffff;
  diy_fp = Single(max_float32).AsDiyFp();
  CHECK_EQ(0xFE - 0x7F - 23, diy_fp.e());
  CHECK_EQ(0x00ffffff, diy_fp.f());
}